

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool ON_SubDEdgeSharpness::EqualTrend(ON_SubDEdgePtr *eptr0,ON_SubDEdgePtr *eptr1)

{
  ON_SubDEdge *pOVar1;
  ON_SubDEdge *pOVar2;
  ON_SubDVertex *pOVar3;
  ON_SubDVertex *pOVar4;
  ON_SubDEdgeSharpness s0;
  ON_SubDEdgeSharpness s1;
  ON_SubDVertex *v;
  ON_SubDEdge *e [2];
  ON_SubDEdgePtr *eptr1_local;
  ON_SubDEdgePtr *eptr0_local;
  
  pOVar1 = ON_SubDEdgePtr::Edge(eptr0);
  pOVar2 = ON_SubDEdgePtr::Edge(eptr1);
  if (((pOVar1 == (ON_SubDEdge *)0x0) || (pOVar2 == (ON_SubDEdge *)0x0)) || (pOVar1 == pOVar2)) {
    eptr0_local._7_1_ = false;
  }
  else if (pOVar1->m_edge_tag == pOVar2->m_edge_tag) {
    pOVar3 = ON_SubDEdgePtr::RelativeVertex(eptr0,1);
    if (pOVar3 == (ON_SubDVertex *)0x0) {
      eptr0_local._7_1_ = false;
    }
    else {
      pOVar4 = ON_SubDEdgePtr::RelativeVertex(eptr1,0);
      if (pOVar3 == pOVar4) {
        s0 = ON_SubDEdgePtr::RelativeSharpness(eptr0,true);
        s1 = ON_SubDEdgePtr::RelativeSharpness(eptr1,true);
        eptr0_local._7_1_ = EqualTrend(s0,s1);
      }
      else {
        eptr0_local._7_1_ = false;
      }
    }
  }
  else {
    eptr0_local._7_1_ = false;
  }
  return eptr0_local._7_1_;
}

Assistant:

bool ON_SubDEdgeSharpness::EqualTrend(
  const ON_SubDEdgePtr& eptr0,
  const ON_SubDEdgePtr& eptr1
)
{
  const ON_SubDEdge* e[2] = { eptr0.Edge(), eptr1.Edge() };
  if (nullptr == e[0] || nullptr == e[1] || e[0] == e[1])
    return false;

  if (e[0]->m_edge_tag != e[1]->m_edge_tag)
    return false;

  const ON_SubDVertex* v = eptr0.RelativeVertex(1);
  if (nullptr == v)
    return false;
  if (v != eptr1.RelativeVertex(0))
    return false;

  return ON_SubDEdgeSharpness::EqualTrend(eptr0.RelativeSharpness(true), eptr1.RelativeSharpness(true));
}